

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O1

void __thiscall cmStateDirectory::SetCurrentSource(cmStateDirectory *this,string *dir)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  PointerType pBVar2;
  string *path;
  string local_40;
  
  pBVar2 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&this->DirectoryState);
  path = &pBVar2->Location;
  std::__cxx11::string::_M_assign((string *)path);
  cmsys::SystemTools::ConvertToUnixSlashes(path);
  cmsys::SystemTools::CollapseFullPath(&local_40,path);
  std::__cxx11::string::operator=((string *)path,(string *)&local_40);
  paVar1 = &local_40.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  ComputeRelativePathTopSource(this);
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"CMAKE_CURRENT_SOURCE_DIR","")
  ;
  cmStateSnapshot::SetDefinition(&this->Snapshot_,&local_40,path);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmStateDirectory::SetCurrentSource(std::string const& dir)
{
  std::string& loc = this->DirectoryState->Location;
  loc = dir;
  cmSystemTools::ConvertToUnixSlashes(loc);
  loc = cmSystemTools::CollapseFullPath(loc);

  this->ComputeRelativePathTopSource();

  this->Snapshot_.SetDefinition("CMAKE_CURRENT_SOURCE_DIR", loc);
}